

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_paramtype.cc
# Opt level: O0

void __thiscall
ParameterizedType::DoGenParseCode
          (ParameterizedType *this,Output *out_cc,Env *env,DataPtr *data,int flags)

{
  FILE *__stream;
  Env *this_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  ID *id;
  ID *pIVar6;
  Env *in_RSI;
  Type *in_RDI;
  string call_parse_func;
  string parse_params;
  char *parse_func;
  Type *ref_type;
  Type *in_stack_fffffffffffffdf8;
  Type *in_stack_fffffffffffffe00;
  ID *in_stack_fffffffffffffe10;
  Env *in_stack_fffffffffffffe18;
  ID *in_stack_fffffffffffffe20;
  Env *in_stack_fffffffffffffe28;
  ParameterizedType *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe60;
  undefined1 uVar7;
  ID *in_stack_fffffffffffffe68;
  Env *in_stack_fffffffffffffe70;
  Env *in_stack_fffffffffffffe88;
  Output *in_stack_fffffffffffffe90;
  Type *in_stack_fffffffffffffe98;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [48];
  string local_58 [32];
  char *local_38;
  Type *local_30;
  Env *local_10;
  
  __stream = _stderr;
  uVar7 = (undefined1)((ulong)in_stack_fffffffffffffe60 >> 0x38);
  local_10 = in_RSI;
  if (FLAGS_pac_debug) {
    pcVar3 = ID::Name((ID *)0x144621);
    fprintf(__stream,"DoGenParseCode for %s\n",pcVar3);
  }
  local_30 = ReferredDataType(in_stack_fffffffffffffe30,
                              SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
  std::__cxx11::string::string(local_58);
  iVar2 = (*(in_RDI->super_DataDepElement)._vptr_DataDepElement[0x16])();
  if (iVar2 == 1) {
    local_38 = "Parse";
    std::__cxx11::string::operator=(local_58,"nullptr, nullptr");
  }
  else {
    bVar1 = Type::incremental_input(local_30);
    if (bVar1) {
      local_38 = "ParseBuffer";
      pcVar3 = Env::RValue(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      std::__cxx11::string::operator=(local_58,pcVar3);
    }
    else {
      local_38 = "Parse";
      pcVar3 = DataPtr::ptr_expr((DataPtr *)0x144758);
      pcVar4 = Env::RValue(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      strfmt_abi_cxx11_((char *)local_88,"%s, %s",pcVar3,pcVar4);
      std::__cxx11::string::operator=(local_58,local_88);
      std::__cxx11::string::~string(local_88);
    }
  }
  bVar1 = ::RequiresAnalyzerContext::compute((DataDepElement *)in_stack_fffffffffffffe20);
  if (bVar1) {
    pcVar3 = Env::RValue(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    strfmt_abi_cxx11_((char *)local_a8,", %s",pcVar3);
    std::__cxx11::string::operator+=(local_58,local_a8);
    std::__cxx11::string::~string(local_a8);
  }
  bVar1 = Type::RequiresByteOrder(in_stack_fffffffffffffe00);
  if (bVar1) {
    Env::Evaluate((Env *)in_stack_fffffffffffffe20,(Output *)in_stack_fffffffffffffe18,
                  in_stack_fffffffffffffe10);
    pcVar3 = Env::RValue(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    strfmt_abi_cxx11_((char *)local_c8,", %s",pcVar3);
    std::__cxx11::string::operator+=(local_58,local_c8);
    std::__cxx11::string::~string(local_c8);
  }
  pcVar4 = Type::lvalue((Type *)0x144963);
  pcVar3 = local_38;
  uVar5 = std::__cxx11::string::c_str();
  strfmt_abi_cxx11_((char *)local_e8,"%s->%s(%s)",pcVar4,pcVar3,uVar5);
  bVar1 = Type::incremental_input(in_RDI);
  if (bVar1) {
    iVar2 = (*(in_RDI->super_DataDepElement)._vptr_DataDepElement[0x16])();
    this_00 = local_10;
    if (iVar2 == 1) {
      uVar5 = std::__cxx11::string::c_str();
      Output::println((Output *)this_00,"%s;",uVar5);
      Type::parsing_complete_var(in_stack_fffffffffffffdf8);
      pcVar3 = Env::LValue((Env *)in_stack_fffffffffffffe00,(ID *)in_stack_fffffffffffffdf8);
      Output::println((Output *)local_10,"%s = true;",pcVar3);
    }
    else {
      Type::parsing_complete_var(in_stack_fffffffffffffdf8);
      id = (ID *)Env::LValue((Env *)in_stack_fffffffffffffe00,(ID *)in_stack_fffffffffffffdf8);
      uVar5 = std::__cxx11::string::c_str();
      Output::println((Output *)local_10,"%s = %s;",id,uVar5);
      pIVar6 = Type::parsing_complete_var(in_stack_fffffffffffffdf8);
      uVar7 = (undefined1)((ulong)pIVar6 >> 0x38);
      bVar1 = Env::Evaluated(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      if (!bVar1) {
        Type::parsing_complete_var(in_stack_fffffffffffffdf8);
        Env::SetEvaluated(local_10,id,(bool)uVar7);
      }
    }
  }
  else {
    bVar1 = Type::AddSizeVar(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                             in_stack_fffffffffffffe88);
    if (bVar1) {
      Type::size_var(in_stack_fffffffffffffe00);
      pcVar3 = Env::LValue((Env *)in_stack_fffffffffffffe00,(ID *)in_stack_fffffffffffffdf8);
      uVar5 = std::__cxx11::string::c_str();
      Output::println((Output *)local_10,"%s = %s;",pcVar3,uVar5);
      Type::size_var(in_stack_fffffffffffffe00);
      Env::SetEvaluated(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,(bool)uVar7);
    }
    else {
      uVar5 = std::__cxx11::string::c_str();
      Output::println((Output *)local_10,"%s;",uVar5);
    }
  }
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void ParameterizedType::DoGenParseCode(Output* out_cc, Env* env, const DataPtr& data, int flags)
	{
	DEBUG_MSG("DoGenParseCode for %s\n", type_id_->Name());

	Type* ref_type = ReferredDataType(true);

	const char* parse_func;
	string parse_params;

	if ( buffer_mode() == BUFFER_NOTHING )
		{
		ASSERT(! ref_type->incremental_input());
		parse_func = kParseFuncWithoutBuffer;
		parse_params = "nullptr, nullptr";
		}
	else if ( ref_type->incremental_input() )
		{
		parse_func = kParseFuncWithBuffer;
		parse_params = env->RValue(flow_buffer_id);
		}
	else
		{
		parse_func = kParseFuncWithoutBuffer;
		parse_params = strfmt("%s, %s", data.ptr_expr(), env->RValue(end_of_data));
		}

	if ( RequiresAnalyzerContext::compute(ref_type) )
		{
		parse_params += strfmt(", %s", env->RValue(analyzer_context_id));
		}

	if ( ref_type->RequiresByteOrder() )
		{
		env->Evaluate(out_cc, byteorder_id);
		parse_params += strfmt(", %s", env->RValue(byteorder_id));
		}

	string call_parse_func = strfmt("%s->%s(%s)",
	                                lvalue(), // parse() needs an LValue
	                                parse_func, parse_params.c_str());

	if ( incremental_input() )
		{
		if ( buffer_mode() == BUFFER_NOTHING )
			{
			out_cc->println("%s;", call_parse_func.c_str());
			out_cc->println("%s = true;", env->LValue(parsing_complete_var()));
			}
		else
			{
			ASSERT(parsing_complete_var());
			out_cc->println("%s = %s;", env->LValue(parsing_complete_var()),
			                call_parse_func.c_str());

			// parsing_complete_var might have been already
			// evaluated when set to false
			if ( ! env->Evaluated(parsing_complete_var()) )
				env->SetEvaluated(parsing_complete_var());
			}
		}
	else
		{
		if ( AddSizeVar(out_cc, env) )
			{
			out_cc->println("%s = %s;", env->LValue(size_var()), call_parse_func.c_str());
			env->SetEvaluated(size_var());
			}
		else
			{
			out_cc->println("%s;", call_parse_func.c_str());
			}
		}
	}